

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xpath_variable::name(xpath_variable *this)

{
  xpath_variable *this_local;
  xpath_variable **local_8;
  
  switch(this->_type) {
  case xpath_type_node_set:
    local_8 = &this[3]._next;
    break;
  case xpath_type_number:
    local_8 = &this[1]._next;
    break;
  case xpath_type_string:
    local_8 = &this[1]._next;
    break;
  case xpath_type_boolean:
    local_8 = (xpath_variable **)((long)&this[1]._type + 1);
    break;
  default:
    local_8 = (xpath_variable **)0x0;
  }
  return (char_t *)local_8;
}

Assistant:

PUGI_IMPL_FN const char_t* xpath_variable::name() const
	{
		switch (_type)
		{
		case xpath_type_node_set:
			return static_cast<const impl::xpath_variable_node_set*>(this)->name;

		case xpath_type_number:
			return static_cast<const impl::xpath_variable_number*>(this)->name;

		case xpath_type_string:
			return static_cast<const impl::xpath_variable_string*>(this)->name;

		case xpath_type_boolean:
			return static_cast<const impl::xpath_variable_boolean*>(this)->name;

		default:
			assert(false && "Invalid variable type"); // unreachable
			return NULL;
		}
	}